

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O1

double units::puconversion::knownConversions(double val,unit_data *start,unit_data *result)

{
  uint uVar1;
  
  uVar1 = (uint)*start & 0xfffffff;
  if (uVar1 == 0x31d2) {
    if (((uint)*result & 0xfffffff) != 0x1d2 && ((uint)*result & 0xfffffff) != 0x800) {
      return NAN;
    }
  }
  else if (uVar1 == 0x800) {
    if (((uint)*result & 0xfffffff) == 0x1d2) {
      return val;
    }
    if (((uint)*result & 0xfffffff) != 0x31d2) {
      return NAN;
    }
  }
  else {
    if (uVar1 != 0x1d2) {
      return NAN;
    }
    if (((uint)*result & 0xfffffff) == 0x800) {
      return val;
    }
    if (((uint)*result & 0xfffffff) != 0x31d2) {
      return NAN;
    }
  }
  return 1.0 / val;
}

Assistant:

constexpr bool equivalent_non_counting(const unit_data& other) const
        {
            return meter_ == other.meter_ && second_ == other.second_ &&
                kilogram_ == other.kilogram_ && ampere_ == other.ampere_ &&
                candela_ == other.candela_ && kelvin_ == other.kelvin_ &&
                currency_ == other.currency_;
        }